

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# excl.c
# Opt level: O2

int nn_excl_recv(nn_excl *self,nn_msg *msg)

{
  FILE *__stream;
  uint uVar1;
  char *pcVar2;
  
  if (self->inpipe == (nn_pipe *)0x0) {
    uVar1 = 0xfffffff5;
  }
  else {
    uVar1 = nn_pipe_recv(self->inpipe,msg);
    if ((int)uVar1 < 0) {
      nn_backtrace_print();
      __stream = _stderr;
      pcVar2 = nn_err_strerror(-uVar1);
      fprintf(__stream,"%s [%d] (%s:%d)\n",pcVar2,(ulong)-uVar1,
              "/workspace/llm4binary/github/license_c_cmakelists/pietern[P]goestools/vendor/nanomsg/src/protocols/utils/excl.c"
              ,0x65);
      fflush(_stderr);
      nn_err_abort();
    }
    if ((uVar1 & 1) != 0) {
      self->inpipe = (nn_pipe *)0x0;
    }
    uVar1 = uVar1 & 0x7ffffffe;
  }
  return uVar1;
}

Assistant:

int nn_excl_recv (struct nn_excl *self, struct nn_msg *msg)
{
    int rc;

    if (nn_slow (!self->inpipe))
        return -EAGAIN;

    rc = nn_pipe_recv (self->inpipe, msg);
    errnum_assert (rc >= 0, -rc);

    if (rc & NN_PIPE_RELEASE)
        self->inpipe = NULL;

    return rc & ~NN_PIPE_RELEASE;
}